

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtr.c
# Opt level: O3

void Bac_ManCollectGateNameOne
               (Mio_Library_t *pLib,Ptr_ObjType_t Type,word Truth,Vec_Ptr_t *vGateNames)

{
  Mio_Gate_t *pGate;
  char *pcVar1;
  
  pGate = Mio_LibraryReadGateByTruth(pLib,Truth);
  if (pGate != (Mio_Gate_t *)0x0) {
    pcVar1 = Mio_GateReadName(pGate);
    if (((int)Type < 0) || (vGateNames->nSize <= (int)Type)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
    }
    vGateNames->pArray[Type] = pcVar1;
  }
  return;
}

Assistant:

void Bac_ManCollectGateNameOne( Mio_Library_t * pLib, Ptr_ObjType_t Type, word Truth, Vec_Ptr_t * vGateNames )
{
    Mio_Gate_t * pGate = Mio_LibraryReadGateByTruth( pLib, Truth );
    if ( pGate != NULL )
        Vec_PtrWriteEntry( vGateNames, Type, Mio_GateReadName(pGate) );
}